

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3WasmString.h
# Opt level: O3

PCH __thiscall WasmString::c_str(WasmString *this)

{
  PCH pcVar1;
  PCH pcVar2;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = this->data;
  pcVar2 = (this->storage)._M_dataplus._M_p;
  if (pcVar1 != (PCH)0x0) {
    if (pcVar1 == pcVar2) {
      return pcVar1;
    }
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar1,pcVar1 + this->size);
    std::__cxx11::string::operator=((string *)&this->storage,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    pcVar2 = (this->storage)._M_dataplus._M_p;
  }
  this->data = pcVar2;
  return pcVar2;
}

Assistant:

PCH c_str ()
    {
        if (!data)
        {
            data = (PCH)storage.c_str ();
        }
        else if (data != storage.c_str ())
        {
            storage = std::string (data, size);
            data = (PCH)storage.c_str ();
        }
        return data;
    }